

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

void MpiReleaseTimeStep(CP_Services Svcs,DP_WS_Stream Stream_v,size_t TimeStep)

{
  pthread_rwlock_t *__rwlock;
  size_t sVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t *__ptr;
  
  (*Svcs->verbose)(*Stream_v,5,"Releasing timestep %ld\n",TimeStep);
  __rwlock = (pthread_rwlock_t *)((long)Stream_v + 0x40);
  pthread_rwlock_rdlock(__rwlock);
  psVar3 = (size_t *)((long)Stream_v + 0x20);
  __ptr = *(size_t **)((long)Stream_v + 0x20);
  pthread_rwlock_unlock(__rwlock);
  if ((__ptr == (size_t *)0x0) || (*__ptr != TimeStep)) {
    pthread_rwlock_rdlock(__rwlock);
    __ptr = (size_t *)*psVar3;
    while( true ) {
      if (__ptr == (size_t *)0x0) {
        pthread_rwlock_unlock(__rwlock);
        return;
      }
      if (*__ptr == TimeStep) break;
      __ptr = (size_t *)__ptr[2];
    }
    pthread_rwlock_unlock(__rwlock);
    pthread_rwlock_wrlock(__rwlock);
    psVar2 = (size_t *)*psVar3;
    if (psVar2 == __ptr) goto LAB_0073c0f7;
    do {
      psVar3 = psVar2;
      psVar2 = (size_t *)psVar3[2];
    } while (psVar2 != __ptr);
    sVar1 = psVar2[2];
    psVar3[2] = sVar1;
    if (sVar1 != 0) goto LAB_0073c108;
    psVar3 = psVar3 + 2;
  }
  else {
    pthread_rwlock_wrlock(__rwlock);
    psVar2 = (size_t *)*psVar3;
LAB_0073c0f7:
    sVar1 = psVar2[2];
    *psVar3 = sVar1;
    if (sVar1 != 0) goto LAB_0073c108;
  }
  *(size_t **)((long)Stream_v + 0x28) = psVar3;
LAB_0073c108:
  pthread_rwlock_unlock(__rwlock);
  free((void *)__ptr[1]);
  free(__ptr);
  return;
}

Assistant:

static void MpiReleaseTimeStep(CP_Services Svcs, DP_WS_Stream Stream_v, size_t TimeStep)
{
    MpiStreamWR Stream = (MpiStreamWR)Stream_v;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose, "Releasing timestep %ld\n", TimeStep);

    pthread_rwlock_rdlock(&Stream->LockTS);
    TimeStepsEntry EntryToDelete = STAILQ_FIRST(&Stream->TimeSteps);
    pthread_rwlock_unlock(&Stream->LockTS);

    // Optimal pathway
    if (EntryToDelete && EntryToDelete->TimeStep == TimeStep)
    {
        pthread_rwlock_wrlock(&Stream->LockTS);
        STAILQ_REMOVE_HEAD(&Stream->TimeSteps, entries);
        pthread_rwlock_unlock(&Stream->LockTS);
    }
    else // General pathway
    {
        EntryToDelete = NULL;

        pthread_rwlock_rdlock(&Stream->LockTS);
        STAILQ_FOREACH(EntryToDelete, &Stream->TimeSteps, entries)
        {
            if (EntryToDelete->TimeStep == TimeStep)
            {
                break;
            }
        }
        pthread_rwlock_unlock(&Stream->LockTS);
        if (EntryToDelete)
        {
            pthread_rwlock_wrlock(&Stream->LockTS);
            STAILQ_REMOVE(&Stream->TimeSteps, EntryToDelete, _TimeStepsEntry, entries);
            pthread_rwlock_unlock(&Stream->LockTS);
        }
    }

    if (EntryToDelete)
    {
        free(EntryToDelete->Data);
        free(EntryToDelete);
    }
}